

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O3

int HasSynonymField(Col_Word word)

{
  uint uVar1;
  
  if (word != 0) {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        return 1;
      }
      uVar1 = *(byte *)word & 0xfffffffe;
    }
    else {
      uVar1 = immediateWordTypes[(uint)word & 0x1f];
    }
    if ((((uVar1 + 1 < 0x30) && ((0x880000000009U >> ((ulong)(uVar1 + 1) & 0x3f) & 1) != 0)) ||
        (uVar1 == 0x42)) || (uVar1 == 0x46)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
HasSynonymField(
    Col_Word word)  /*!< The word to test. */
{
    switch (WORD_TYPE(word)) {
    case WORD_TYPE_CUSTOM:
    case WORD_TYPE_WRAP:
    case WORD_TYPE_STRHASHMAP:
    case WORD_TYPE_INTHASHMAP:
    case WORD_TYPE_STRTRIEMAP:
    case WORD_TYPE_INTTRIEMAP:
        return 1;

    /* WORD_TYPE_UNKNOWN */

    default:
        return 0;
    }
}